

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O0

cn_cbor * cn_cbor_index(cn_cbor *cb,uint idx)

{
  uint local_2c;
  cn_cbor *pcStack_28;
  uint i;
  cn_cbor *cp;
  uint idx_local;
  cn_cbor *cb_local;
  
  local_2c = 0;
  if (cb == (cn_cbor *)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                  ,0x3c,"cn_cbor *cn_cbor_index(const cn_cbor *, unsigned int)");
  }
  pcStack_28 = cb->first_child;
  while( true ) {
    if (pcStack_28 == (cn_cbor *)0x0) {
      return (cn_cbor *)0x0;
    }
    if (local_2c == idx) break;
    local_2c = local_2c + 1;
    pcStack_28 = pcStack_28->next;
  }
  return pcStack_28;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_index(const cn_cbor* cb, unsigned int idx) {
  cn_cbor *cp;
  unsigned int i = 0;
  assert(cb);
  for (cp = cb->first_child; cp; cp = cp->next) {
    if (i == idx) {
      return cp;
    }
    i++;
  }
  return NULL;
}